

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionRenderTargets
          (DeviceContextVkImpl *this,RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  bool bVar1;
  RESOURCE_STATE RequiredState;
  VkImageLayout VVar2;
  int iVar3;
  RenderPassVkImpl *pRVar4;
  Char *pCVar5;
  TextureViewDesc *pTVar6;
  TextureViewVkImpl *pTVar7;
  TextureVkImpl *pTVar8;
  RenderDeviceVkImpl *this_00;
  VulkanLogicalDevice *this_01;
  ExtensionFeatures *pEVar9;
  ITextureView *pIVar10;
  undefined4 extraout_var;
  char (*in_RCX) [91];
  undefined1 local_c8 [4];
  VkImageLayout vkRequiredLayout;
  string msg_2;
  TextureVkImpl *pShadingRateMapVk;
  ExtensionFeatures *ExtFeatures;
  TextureVkImpl *pRenderTargetVk;
  TextureViewImplType *pRTVVk;
  Uint32 rt;
  TextureVkImpl *pDepthBufferVk;
  VkImageLayout ExpectedLayout;
  RESOURCE_STATE NewState;
  bool bReadOnly;
  string msg_1;
  TEXTURE_VIEW_TYPE ViewType;
  undefined1 local_38 [8];
  string msg;
  RESOURCE_STATE_TRANSITION_MODE StateTransitionMode_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._M_local_buf[0xf] = StateTransitionMode;
  if ((StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) &&
     (pRVar4 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                         ((RefCntAutoPtr *)
                          &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                           super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass
                         ), pRVar4 != (RenderPassVkImpl *)0x0)) {
    FormatString<char[56]>
              ((string *)local_38,
               (char (*) [56])"State transitions are not allowed inside a render pass.");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [91])0x6fb;
    DebugAssertionFailed
              (pCVar5,"TransitionRenderTargets",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x6fb);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil);
  if (bVar1) {
    pTVar7 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pTVar6 = DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
             ::GetDesc((DeviceObjectBase<Diligent::ITextureViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureViewDesc>
                        *)pTVar7);
    msg_1.field_2._M_local_buf[0xb] = pTVar6->ViewType;
    if ((msg_1.field_2._M_local_buf[0xb] != TEXTURE_VIEW_DEPTH_STENCIL) &&
       (msg_1.field_2._M_local_buf[0xb] != TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)) {
      FormatString<char[26],char[91]>
                ((string *)&NewState,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL"
                 ,in_RCX);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"TransitionRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x700);
      std::__cxx11::string::~string((string *)&NewState);
    }
    RequiredState = RESOURCE_STATE_DEPTH_WRITE;
    if (msg_1.field_2._M_local_buf[0xb] == '\x04') {
      RequiredState = RESOURCE_STATE_DEPTH_READ;
    }
    VVar2 = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
    if (msg_1.field_2._M_local_buf[0xb] == '\x04') {
      VVar2 = VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL;
    }
    pTVar7 = RefCntAutoPtr<Diligent::TextureViewVkImpl>::operator->
                       (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundDepthStencil)
    ;
    pTVar8 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture<Diligent::TextureVkImpl>
                       (&pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>);
    TransitionOrVerifyTextureState
              (this,pTVar8,msg.field_2._M_local_buf[0xf],RequiredState,VVar2,
               "Binding depth-stencil buffer (DeviceContextVkImpl::TransitionRenderTargets)");
  }
  for (pRTVVk._4_4_ = 0;
      pRTVVk._4_4_ <
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_NumBoundRenderTargets;
      pRTVVk._4_4_ = pRTVVk._4_4_ + 1) {
    pTVar7 = Diligent::RefCntAutoPtr::operator_cast_to_TextureViewVkImpl_
                       ((RefCntAutoPtr *)
                        ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundRenderTargets
                        + pRTVVk._4_4_));
    if (pTVar7 != (TextureViewVkImpl *)0x0) {
      pTVar8 = TextureViewBase<Diligent::EngineVkImplTraits>::GetTexture<Diligent::TextureVkImpl>
                         (&pTVar7->super_TextureViewBase<Diligent::EngineVkImplTraits>);
      TransitionOrVerifyTextureState
                (this,pTVar8,msg.field_2._M_local_buf[0xf],RESOURCE_STATE_RENDER_TARGET,
                 VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                 "Binding render targets (DeviceContextVkImpl::TransitionRenderTargets)");
    }
  }
  bVar1 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                    ((RefCntAutoPtr *)
                     &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundShadingRateMap);
  if (bVar1) {
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator->
                        (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice);
    this_01 = RenderDeviceVkImpl::GetLogicalDevice(this_00);
    pEVar9 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(this_01);
    pIVar10 = RefCntAutoPtr<Diligent::ITextureView>::operator->
                        (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.
                          m_pBoundShadingRateMap);
    iVar3 = (*(pIVar10->super_IDeviceObject).super_IObject._vptr_IObject[10])();
    msg_2.field_2._8_8_ =
         ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>
                   ((ITexture *)CONCAT44(extraout_var,iVar3));
    bVar1 = (pEVar9->FragmentDensityMap).fragmentDensityMap != 0;
    if (((pEVar9->ShadingRate).attachmentFragmentShadingRate != 0) == bVar1) {
      FormatString<char[26],char[134]>
                ((string *)local_c8,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "(ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE) ^ (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE)"
                 ,(char (*) [134])(ulong)bVar1);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"TransitionRenderTargets",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x71e);
      std::__cxx11::string::~string((string *)local_c8);
    }
    VVar2 = VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
    if ((pEVar9->ShadingRate).attachmentFragmentShadingRate != 0) {
      VVar2 = VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR;
    }
    TransitionOrVerifyTextureState
              (this,(TextureVkImpl *)msg_2.field_2._8_8_,msg.field_2._M_local_buf[0xf],
               RESOURCE_STATE_MAX_BIT,VVar2,
               "Binding shading rate map (DeviceContextVkImpl::TransitionRenderTargets)");
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionRenderTargets(RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    VERIFY(StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_TRANSITION || m_pActiveRenderPass == nullptr,
           "State transitions are not allowed inside a render pass.");

    if (m_pBoundDepthStencil)
    {
        const TEXTURE_VIEW_TYPE ViewType = m_pBoundDepthStencil->GetDesc().ViewType;
        VERIFY_EXPR(ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
        const bool bReadOnly = ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL;

        const RESOURCE_STATE NewState = bReadOnly ?
            RESOURCE_STATE_DEPTH_READ :
            RESOURCE_STATE_DEPTH_WRITE;

        const VkImageLayout ExpectedLayout = bReadOnly ?
            VK_IMAGE_LAYOUT_DEPTH_STENCIL_READ_ONLY_OPTIMAL :
            VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;

        TextureVkImpl* pDepthBufferVk = m_pBoundDepthStencil->GetTexture<TextureVkImpl>();
        TransitionOrVerifyTextureState(*pDepthBufferVk, StateTransitionMode, NewState, ExpectedLayout,
                                       "Binding depth-stencil buffer (DeviceContextVkImpl::TransitionRenderTargets)");
    }

    for (Uint32 rt = 0; rt < m_NumBoundRenderTargets; ++rt)
    {
        if (TextureViewImplType* pRTVVk = m_pBoundRenderTargets[rt])
        {
            TextureVkImpl* pRenderTargetVk = pRTVVk->GetTexture<TextureVkImpl>();
            TransitionOrVerifyTextureState(*pRenderTargetVk, StateTransitionMode, RESOURCE_STATE_RENDER_TARGET, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
                                           "Binding render targets (DeviceContextVkImpl::TransitionRenderTargets)");
        }
    }

    if (m_pBoundShadingRateMap)
    {
        const VulkanUtilities::VulkanLogicalDevice::ExtensionFeatures& ExtFeatures       = m_pDevice->GetLogicalDevice().GetEnabledExtFeatures();
        TextureVkImpl*                                                 pShadingRateMapVk = ClassPtrCast<TextureVkImpl>(m_pBoundShadingRateMap->GetTexture());
        VERIFY_EXPR((ExtFeatures.ShadingRate.attachmentFragmentShadingRate != VK_FALSE) ^ (ExtFeatures.FragmentDensityMap.fragmentDensityMap != VK_FALSE));
        const VkImageLayout vkRequiredLayout = ExtFeatures.ShadingRate.attachmentFragmentShadingRate ?
            VK_IMAGE_LAYOUT_FRAGMENT_SHADING_RATE_ATTACHMENT_OPTIMAL_KHR :
            VK_IMAGE_LAYOUT_FRAGMENT_DENSITY_MAP_OPTIMAL_EXT;
        TransitionOrVerifyTextureState(*pShadingRateMapVk, StateTransitionMode, RESOURCE_STATE_SHADING_RATE, vkRequiredLayout,
                                       "Binding shading rate map (DeviceContextVkImpl::TransitionRenderTargets)");
    }
}